

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O1

Vec_Int_t * Aig_ManPartitionLevelized(Aig_Man_t *p,int nPartSize)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  Vec_Vec_t *__ptr;
  Vec_Int_t *pVVar6;
  int *__s;
  int iVar7;
  long lVar8;
  long lVar9;
  
  __ptr = Aig_ManLevelize(p);
  iVar1 = p->vObjs->nSize;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  if (0 < (long)__ptr->nSize) {
    iVar7 = 0;
    lVar9 = (long)__ptr->nSize;
    do {
      if (__ptr->nSize < lVar9) {
LAB_00691b31:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar3 = __ptr->pArray[lVar9 + -1];
      lVar8 = (long)*(int *)((long)pvVar3 + 4);
      if (0 < lVar8) {
        do {
          if (__ptr->nSize < lVar9) goto LAB_00691b31;
          if (*(int *)((long)pvVar3 + 4) < lVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar2 = *(int *)(*(long *)(*(long *)((long)pvVar3 + 8) + -8 + lVar8 * 8) + 0x24);
          if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar5 = iVar7 / nPartSize;
          iVar7 = iVar7 + 1;
          __s[iVar2] = iVar5;
          lVar8 = lVar8 + -1;
        } while ((int)lVar8 != 0);
      }
      bVar4 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar4);
  }
  if (0 < __ptr->nSize) {
    lVar9 = 0;
    do {
      pvVar3 = __ptr->pArray[lVar9];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Vec_t *)0x0) {
    free(__ptr);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Aig_ManPartitionLevelized( Aig_Man_t * p, int nPartSize )
{
    Vec_Int_t * vId2Part;
    Vec_Vec_t * vNodes;
    Aig_Obj_t * pObj;
    int i, k, Counter = 0;
    vNodes = Aig_ManLevelize( p );
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    Vec_VecForEachEntryReverseReverse( Aig_Obj_t *, vNodes, pObj, i, k )
        Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    Vec_VecFree( vNodes );
    return vId2Part;
}